

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSession::SetDefaultTimestampIncrement(RTPSession *this,uint32_t timestampinc)

{
  int status;
  uint32_t timestampinc_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    this_local._4_4_ =
         RTPPacketBuilder::SetDefaultTimestampIncrement(&this->packetbuilder,timestampinc);
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SetDefaultTimestampIncrement(uint32_t timestampinc)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	BUILDER_LOCK
	status = packetbuilder.SetDefaultTimestampIncrement(timestampinc);
	BUILDER_UNLOCK
	return status;
}